

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexfloat.c
# Opt level: O0

void flexfloat_sanitize(flexfloat_t *a)

{
  _Bool _Var1;
  _Bool _Var2;
  int iVar3;
  double dVar4;
  fp_t fVar5;
  flexfloat_t *in_RDI;
  int shift;
  uint_t denorm;
  int_t rounding_value_2;
  int_t rounding_value_1;
  int_t rounding_value;
  int mode;
  uint_t frac;
  int_fast16_t inf_exp;
  int_fast16_t exp;
  _Bool sign;
  undefined4 in_stack_ffffffffffffffa8;
  undefined2 in_stack_ffffffffffffffac;
  undefined1 in_stack_ffffffffffffffae;
  undefined1 in_stack_ffffffffffffffaf;
  uint_t in_stack_ffffffffffffffb0;
  flexfloat_t *in_stack_ffffffffffffffb8;
  double in_stack_ffffffffffffffc0;
  long local_18;
  
  _Var1 = flexfloat_sign(in_RDI);
  local_18 = flexfloat_exp(in_stack_ffffffffffffffb8);
  if (((in_RDI->desc).exp_bits != '\v') || ((in_RDI->desc).frac_bits != '4')) {
    if ((local_18 != 0x7ff) && ((in_RDI->desc).frac_bits != '4')) {
      iVar3 = fegetround();
      if ((iVar3 == 0) &&
         (_Var2 = flexfloat_nearest_rounding
                            ((flexfloat_t *)
                             CONCAT17(in_stack_ffffffffffffffaf,
                                      CONCAT16(in_stack_ffffffffffffffae,
                                               CONCAT24(in_stack_ffffffffffffffac,
                                                        in_stack_ffffffffffffffa8))),0x102d89),
         _Var2)) {
        dVar4 = (double)flexfloat_rounding_value
                                  (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                                   (_Bool)in_stack_ffffffffffffffaf);
        in_RDI->value = in_RDI->value + dVar4;
      }
      else if ((iVar3 == 0x800) &&
              (_Var2 = flexfloat_inf_rounding
                                 (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                                  (_Bool)in_stack_ffffffffffffffaf,(_Bool)in_stack_ffffffffffffffae)
              , _Var2)) {
        in_stack_ffffffffffffffc0 =
             (double)flexfloat_rounding_value
                               (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                                (_Bool)in_stack_ffffffffffffffaf);
        in_RDI->value = in_RDI->value + in_stack_ffffffffffffffc0;
      }
      else if ((iVar3 == 0x400) &&
              (_Var2 = flexfloat_inf_rounding
                                 (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                                  (_Bool)in_stack_ffffffffffffffaf,(_Bool)in_stack_ffffffffffffffae)
              , _Var2)) {
        in_stack_ffffffffffffffb8 =
             (flexfloat_t *)
             flexfloat_rounding_value
                       (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                        (_Bool)in_stack_ffffffffffffffaf);
        in_RDI->value = in_RDI->value + (double)in_stack_ffffffffffffffb8;
      }
      local_18 = flexfloat_exp(in_stack_ffffffffffffffb8);
    }
    flexfloat_inf_exp(in_RDI->desc);
    flexfloat_frac(in_RDI);
    if (((ulong)in_RDI->value >> 0x34 & 0x7ff) == 0) {
      fVar5 = (fp_t)flexfloat_denorm_pack
                              (SUB82(in_stack_ffffffffffffffb0 >> 0x30,0),
                               SUB81(in_stack_ffffffffffffffb0 >> 0x28,0),
                               CONCAT17(in_stack_ffffffffffffffaf,
                                        CONCAT16(in_stack_ffffffffffffffae,
                                                 CONCAT24(in_stack_ffffffffffffffac,
                                                          in_stack_ffffffffffffffa8))));
      in_RDI->value = fVar5;
    }
    else if ((local_18 < 1) &&
            (in_stack_ffffffffffffffb0 = flexfloat_denorm_frac(in_RDI,local_18),
            in_stack_ffffffffffffffb0 == 0)) {
      in_RDI->value = (fp_t)((ulong)_Var1 << 0x3f);
    }
    else {
      fVar5 = (fp_t)flexfloat_pack(SUB82((ulong)in_stack_ffffffffffffffc0 >> 0x30,0),
                                   SUB81((ulong)in_stack_ffffffffffffffc0 >> 0x28,0),
                                   (int_fast16_t)in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0
                                  );
      in_RDI->value = fVar5;
    }
  }
  return;
}

Assistant:

void flexfloat_sanitize(flexfloat_t *a)
{
    bool sign;
    int_fast16_t exp;
    int_fast16_t inf_exp;
    uint_t frac;


    // Sign
    sign = flexfloat_sign(a);

    // Exponent
    exp = flexfloat_exp(a);

    // This case does not require to be sanitized (except for NaNs)
    if(a->desc.exp_bits  == NUM_BITS_EXP && a->desc.frac_bits == NUM_BITS_FRAC)
    {
#ifdef NAN_NORMALIZATION	    
        if(exp == INF_EXP && (CAST_TO_INT(a->value) & MASK_FRAC)) // NaN
        {
        // Sanitize to canonical NaN (positive sign, quiet bit set)
        sign = 0;
        frac = UINT_C(1) << a->desc.frac_bits-1;
        CAST_TO_INT(a->value) = flexfloat_pack(a->desc, sign, exp, frac);
        }
#endif
        return;
    }

    // printf("enter sanitize: 0x%016lx s%d e%d m0x%013lx\n", CAST_TO_INT(a->value), sign, exp, CAST_TO_INT(a->value)&MASK_FRAC);

#ifdef FLEXFLOAT_ROUNDING
    // In these cases no rounding is needed
    if (!(exp == INF_EXP  || a->desc.frac_bits == NUM_BITS_FRAC))
    {
#ifdef FLEXFLOAT_FLAGS
        // Inexact results raise an exception
        if(flexfloat_round_bit(a, exp) || flexfloat_sticky_bit(a, exp))
            feraiseexcept(FE_INEXACT);
        // As rounding uses FP operations, we don't want to tarnish the accrued flags
        fexcept_t flags;
        fegetexceptflag(&flags, FE_ALL_EXCEPT);
#endif
        // Rounding mode
        int mode = fegetround();
        if(mode == FE_TONEAREST && flexfloat_nearest_rounding(a, exp))
        {
            int_t rounding_value = flexfloat_rounding_value(a, exp, sign);
            a->value +=  CAST_TO_FP(rounding_value);
        }
        else if(mode == FE_UPWARD && flexfloat_inf_rounding(a, exp, sign, 1))
        {
            int_t rounding_value = flexfloat_rounding_value(a, exp, sign);
            a->value +=  CAST_TO_FP(rounding_value);
        }
        else if(mode == FE_DOWNWARD && flexfloat_inf_rounding(a, exp, sign, 0))
        {
            int_t rounding_value = flexfloat_rounding_value(a, exp, sign);
            a->value +=  CAST_TO_FP(rounding_value);
        }
#ifdef FLEXFLOAT_FLAGS
        // Restore flags from before
        fesetexceptflag(&flags, FE_ALL_EXCEPT);
#endif
        //a->value = a->value;
        __asm__ __volatile__ ("" ::: "memory");

        // Recompute exponent value after rounding
        exp = flexfloat_exp(a);
    }
#endif

    // Exponent of NaN and Inf (target format)
    inf_exp = flexfloat_inf_exp(a->desc);

    // Mantissa
    frac = flexfloat_frac(a);

    if(EXPONENT(CAST_TO_INT(a->value)) == 0) // Denorm backend format - represented format also denormal
    {
        CAST_TO_INT(a->value) = flexfloat_denorm_pack(a->desc, sign, frac);
        return;
    }

   if(exp <= 0) // Denormalized value in the target format (saved in normalized format in the backend value)
    {
#ifdef FLEXFLOAT_FLAGS
        // Raise the underflow exception
        feraiseexcept(FE_UNDERFLOW);
#endif
        uint_t denorm = flexfloat_denorm_frac(a, exp);
        if(denorm == 0) // value too low to be represented, return zero
        {
            CAST_TO_INT(a->value) = PACK(sign, 0, 0);
            return;
        }
        else if(a->desc.frac_bits < NUM_BITS_FRAC) // Remove additional precision
        {
            int shift = - exp + 1;
            if(shift < NUM_BITS_FRAC)
            {
              frac >>= shift;
              frac <<= shift;
            }
            else
            {
              frac = UINT_C(0);
            }
        }
    }
    else if(exp == INF_EXP && (CAST_TO_INT(a->value) & MASK_FRAC)) // NaN
    {
        exp  = inf_exp;
#ifdef NAN_NORMALIZATION	
        // Sanitize to canonical NaN (positive sign, quiet bit set)
        sign = 0;
        frac = UINT_C(1) << a->desc.frac_bits-1;
#endif	
    }
    else if(exp == INF_EXP) // Inf
    {
#ifdef FLEXFLOAT_FLAGS
        // Raise the proper overflow exception, unless a DIV/0 exception had occured
        if (!fetestexcept(FE_DIVBYZERO))
            feraiseexcept(FE_OVERFLOW | FE_INEXACT);
#endif
        exp = inf_exp;
    }
    else if(exp >= inf_exp) // Out of bounds for target format: set infinity
    {
#ifdef FLEXFLOAT_FLAGS
        // Raise the proper overflow exception
        feraiseexcept(FE_OVERFLOW | FE_INEXACT);
#endif
        exp = inf_exp;
        frac = UINT_C(0);
    }

    // printf("ENCODING: %d %d %lu\n", sign, exp, frac);
    CAST_TO_INT(a->value) = flexfloat_pack(a->desc, sign, exp, frac);
}